

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O3

void Sfm_TimNodeRequired(Sfm_Tim_t *p,Abc_Obj_t *pNode)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  Mio_Gate_t *pGate;
  Mio_PinPhase_t MVar4;
  Mio_Pin_t *pPin;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  int *pTimesIn [6];
  long alStack_68 [7];
  
  uVar1 = pNode->Id;
  uVar9 = (ulong)uVar1;
  if ((int)uVar1 < 0) {
LAB_0053bc63:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  iVar5 = (p->vTimReqs).nSize;
  if (iVar5 <= (int)(uVar1 * 2)) {
LAB_0053bc82:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  iVar6 = (pNode->vFanins).nSize;
  if (6 < (long)iVar6) {
    __assert_fail("Abc_ObjFaninNum(pNode) <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                  ,0x88,"void Sfm_TimNodeRequired(Sfm_Tim_t *, Abc_Obj_t *)");
  }
  piVar2 = (p->vTimReqs).pArray;
  if (0 < iVar6) {
    piVar3 = (pNode->vFanins).pArray;
    lVar8 = 0;
    do {
      uVar1 = piVar3[lVar8];
      if ((int)uVar1 < 0) goto LAB_0053bc63;
      if (iVar5 <= (int)(uVar1 * 2)) goto LAB_0053bc82;
      alStack_68[lVar8] = (long)(piVar2 + (ulong)uVar1 * 2);
      lVar8 = lVar8 + 1;
    } while (iVar6 != lVar8);
  }
  pGate = (Mio_Gate_t *)(pNode->field_5).pData;
  pPin = Mio_GateReadPins(pGate);
  if (pPin == (Mio_Pin_t *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    do {
      piVar3 = (int *)alStack_68[lVar8];
      MVar4 = Mio_PinReadPhase(pPin);
      dVar10 = Mio_PinReadDelayBlockRise(pPin);
      dVar11 = Mio_PinReadDelayBlockFall(pPin);
      iVar5 = *piVar3;
      if (MVar4 == MIO_PHASE_INV) {
        iVar6 = piVar3[1];
LAB_0053bc09:
        iVar7 = piVar2[uVar9 * 2 + 1] - (int)((float)dVar10 * 1000.0);
        if (iVar5 < iVar7) {
          iVar7 = iVar5;
        }
        *piVar3 = iVar7;
        iVar5 = piVar2[uVar9 * 2] - (int)((float)dVar11 * 1000.0);
        if (iVar6 < iVar5) {
          iVar5 = iVar6;
        }
        piVar3[1] = iVar5;
      }
      else {
        iVar6 = piVar2[uVar9 * 2] - (int)((float)dVar10 * 1000.0);
        if (iVar6 <= iVar5) {
          iVar5 = iVar6;
        }
        *piVar3 = iVar5;
        iVar6 = piVar2[uVar9 * 2 + 1] - (int)((float)dVar11 * 1000.0);
        if (piVar3[1] < iVar6) {
          iVar6 = piVar3[1];
        }
        piVar3[1] = iVar6;
        if (MVar4 != MIO_PHASE_NONINV) goto LAB_0053bc09;
      }
      pPin = Mio_PinReadNext(pPin);
      lVar8 = lVar8 + 1;
    } while (pPin != (Mio_Pin_t *)0x0);
  }
  iVar5 = Mio_GateReadPinNum(pGate);
  if ((int)lVar8 != iVar5) {
    __assert_fail("i == Mio_GateReadPinNum(pGate)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                  ,0x82,"void Sfm_TimGateRequired(Sfm_Tim_t *, Mio_Gate_t *, int **, int *)");
  }
  return;
}

Assistant:

void Sfm_TimNodeRequired( Sfm_Tim_t * p, Abc_Obj_t * pNode )
{
    int i, iFanin, * pTimesIn[6];
    int * pTimeOut = Sfm_TimReq(p, pNode);
    assert( Abc_ObjFaninNum(pNode) <= 6 );
    Abc_ObjForEachFaninId( pNode, iFanin, i )
        pTimesIn[i] = Sfm_TimReqId( p, iFanin );
    Sfm_TimGateRequired( p, (Mio_Gate_t *)pNode->pData, pTimesIn, pTimeOut );
}